

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int cram_write_file_def(cram_fd *fd,cram_file_def *def)

{
  hFILE *fp;
  size_t __n;
  ulong uVar1;
  
  fp = fd->fp;
  uVar1 = (long)fp->limit - (long)fp->begin;
  __n = 0x1a;
  if (uVar1 < 0x1a) {
    __n = uVar1;
  }
  memcpy(fp->begin,def,__n);
  fp->begin = fp->begin + __n;
  if (uVar1 < 0x1a) {
    __n = hwrite2(fp,def,0x1a,__n);
  }
  return -(uint)(__n != 0x1a);
}

Assistant:

int cram_write_file_def(cram_fd *fd, cram_file_def *def) {
    return (hwrite(fd->fp, &def->magic[0], 26) == 26) ? 0 : -1;
}